

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  curl_proxytype cVar1;
  uint uVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  SessionHandle *pSVar6;
  size_t sVar7;
  connectdata *pcVar8;
  char *pcVar9;
  curl_llist *pcVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  ulong uVar16;
  connectdata *pcVar17;
  hostname *host;
  long lVar18;
  Curl_handler **ppCVar19;
  connectbundle *bundle;
  Curl_handler *pCVar20;
  bool bVar21;
  _Bool _Var22;
  timeval tVar23;
  _Bool force_reuse;
  char *passwd;
  char *user;
  char *options;
  char *userp;
  char *passwdp;
  connectdata *conn_temp;
  char protobuf [16];
  _Bool local_c9;
  _Bool *local_c8;
  undefined4 local_bc;
  connectdata **local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  _Bool *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  size_t local_68;
  SessionHandle *local_60;
  size_t local_58;
  connectdata *local_50;
  undefined1 local_48 [16];
  
  *asyncp = false;
  local_50 = (connectdata *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  local_90 = (char *)0x0;
  local_c9 = false;
  pSVar6 = (SessionHandle *)Curl_multi_max_host_connections(data->multi);
  sVar7 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    CVar5 = CURLE_URL_MALFORMAT;
    in_connect = in_connect;
    protocol_done = protocol_done;
    asyncp = asyncp;
    goto LAB_00119fbd;
  }
  local_60 = pSVar6;
  local_58 = sVar7;
  pcVar8 = (connectdata *)(*Curl_ccalloc)(1,0x618);
  if (pcVar8 == (connectdata *)0x0) {
LAB_00119d23:
    pcVar8 = (connectdata *)0x0;
  }
  else {
    pcVar8->handler = &Curl_handler_dummy;
    pcVar8->connection_id = -1;
    pcVar8->port = -1;
    pcVar8->remote_port = -1;
    pcVar8->sock[0] = -1;
    pcVar8->sock[1] = -1;
    pcVar8->tempsock[0] = -1;
    pcVar8->tempsock[1] = -1;
    (pcVar8->bits).close = true;
    tVar23 = curlx_tvnow();
    pcVar8->created = tVar23;
    pcVar8->data = data;
    cVar1 = (data->set).proxytype;
    pcVar8->proxytype = cVar1;
    pcVar9 = (data->set).str[0x10];
    if (pcVar9 == (char *)0x0) {
      (pcVar8->bits).proxy = false;
LAB_00119bbe:
      _Var22 = false;
    }
    else {
      bVar21 = *pcVar9 == '\0';
      (pcVar8->bits).proxy = !bVar21;
      if (bVar21) goto LAB_00119bbe;
      if (cVar1 == CURLPROXY_HTTP) {
        _Var22 = true;
      }
      else {
        _Var22 = cVar1 == CURLPROXY_HTTP_1_0;
      }
    }
    (pcVar8->bits).httpproxy = _Var22;
    (pcVar8->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
    (pcVar8->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (pcVar8->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
    (pcVar8->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (pcVar8->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    pcVar8->verifypeer = (data->set).ssl.verifypeer;
    pcVar8->verifyhost = (data->set).ssl.verifyhost;
    pcVar8->ip_version = (data->set).ipver;
    _Var22 = Curl_multi_pipeline_enabled(data->multi);
    if ((_Var22) && (pcVar8->master_buffer == (char *)0x0)) {
      pcVar9 = (char *)(*Curl_ccalloc)(0x4000,1);
      pcVar8->master_buffer = pcVar9;
      if (pcVar9 != (char *)0x0) goto LAB_00119c74;
LAB_00119cae:
      Curl_llist_destroy(pcVar8->send_pipe,(void *)0x0);
      Curl_llist_destroy(pcVar8->recv_pipe,(void *)0x0);
      pcVar8->send_pipe = (curl_llist *)0x0;
      pcVar8->recv_pipe = (curl_llist *)0x0;
      if (pcVar8->master_buffer != (char *)0x0) {
        (*Curl_cfree)(pcVar8->master_buffer);
        pcVar8->master_buffer = (char *)0x0;
      }
      if (pcVar8->localdev != (char *)0x0) {
        (*Curl_cfree)(pcVar8->localdev);
        pcVar8->localdev = (char *)0x0;
      }
      (*Curl_cfree)(pcVar8);
      goto LAB_00119d23;
    }
LAB_00119c74:
    pcVar10 = Curl_llist_alloc(llist_dtor);
    pcVar8->send_pipe = pcVar10;
    pcVar10 = Curl_llist_alloc(llist_dtor);
    pcVar8->recv_pipe = pcVar10;
    if (pcVar10 == (curl_llist *)0x0 || pcVar8->send_pipe == (curl_llist *)0x0) goto LAB_00119cae;
    pcVar9 = (data->set).str[5];
    if (pcVar9 != (char *)0x0) {
      pcVar9 = (*Curl_cstrdup)(pcVar9);
      pcVar8->localdev = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_00119cae;
    }
    pcVar8->localportrange = (data->set).localportrange;
    pcVar8->localport = (data->set).localport;
    pcVar8->fclosesocket = (data->set).fclosesocket;
    pcVar8->closesocket_client = (data->set).closesocket_client;
  }
  if (pcVar8 == (connectdata *)0x0) {
LAB_00119fb7:
    CVar5 = CURLE_OUT_OF_MEMORY;
    goto LAB_00119fbd;
  }
  *in_connect = pcVar8;
  local_88 = asyncp;
  sVar11 = strlen((data->change).url);
  sVar12 = 0x100;
  if (0x100 < sVar11) {
    sVar12 = sVar11;
  }
  pcVar9 = (data->state).pathbuffer;
  if (pcVar9 != (char *)0x0) {
    (*Curl_cfree)(pcVar9);
    (data->state).pathbuffer = (char *)0x0;
  }
  (data->state).path = (char *)0x0;
  pcVar9 = (char *)(*Curl_cmalloc)(sVar12 + 2);
  (data->state).pathbuffer = pcVar9;
  if (pcVar9 == (char *)0x0) {
    CVar5 = CURLE_OUT_OF_MEMORY;
    in_connect = in_connect;
    protocol_done = protocol_done;
    asyncp = local_88;
    goto LAB_00119fbd;
  }
  (data->state).path = pcVar9;
  pcVar9 = (char *)(*Curl_cmalloc)(sVar12 + 2);
  asyncp = local_88;
  (pcVar8->host).rawalloc = pcVar9;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (data->state).pathbuffer;
    if (pcVar9 != (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      (data->state).pathbuffer = (char *)0x0;
    }
    (data->state).path = (char *)0x0;
    goto LAB_00119fb7;
  }
  (pcVar8->host).name = pcVar9;
  *pcVar9 = '\0';
  local_b8 = in_connect;
  local_98 = (*Curl_cstrdup)("");
  local_a0 = (*Curl_cstrdup)("");
  local_90 = (*Curl_cstrdup)("");
  asyncp = local_88;
  if (local_90 == (char *)0x0 || (local_a0 == (char *)0x0 || local_98 == (char *)0x0)) {
    CVar5 = CURLE_OUT_OF_MEMORY;
    in_connect = local_b8;
    protocol_done = protocol_done;
    goto LAB_00119fbd;
  }
  local_b0 = (data->state).path;
  local_a8 = local_48;
  local_48 = (undefined1  [16])0x0;
  iVar4 = __isoc99_sscanf((data->change).url,"%15[^:]:%[^\n]");
  in_connect = local_b8;
  local_c8 = protocol_done;
  if ((iVar4 == 2) && (iVar4 = Curl_raw_equal(local_48,"file"), iVar4 != 0)) {
    if ((*local_b0 == '/') && (local_b0[1] == '/')) {
      pcVar9 = local_b0 + 2;
      sVar12 = strlen(pcVar9);
      memmove(local_b0,pcVar9,sVar12 + 1);
    }
    if ((*local_b0 != '/') && (pcVar9 = strchr(local_b0,0x2f), pcVar9 != (char *)0x0)) {
      pcVar15 = pcVar9 + 1;
      if (pcVar9[1] != '/') {
        pcVar15 = pcVar9;
      }
      sVar12 = strlen(pcVar15);
      memmove(local_b0,pcVar15,sVar12 + 1);
    }
    local_bc = 0;
    local_a8 = "file";
LAB_0011a1f1:
    pcVar9 = (pcVar8->host).name;
    pcVar13 = strchr(pcVar9,0x40);
    pcVar15 = pcVar13 + 1;
    if (pcVar13 == (char *)0x0) {
      pcVar15 = pcVar9;
    }
    pcVar9 = strchr(pcVar15,0x3f);
    if (pcVar9 == (char *)0x0) {
      pcVar15 = local_b0;
      if (*local_b0 == '\0') {
        local_b0[0] = '/';
        local_b0[1] = '\0';
        goto LAB_0011a26c;
      }
      bVar21 = false;
    }
    else {
      sVar12 = strlen(pcVar9);
      pcVar15 = local_b0;
      sVar11 = strlen(local_b0);
      memmove(pcVar15 + sVar12 + 1,pcVar15,sVar11 + 1);
      memcpy(pcVar15 + 1,pcVar9,sVar12);
      *pcVar15 = '/';
      *pcVar9 = '\0';
LAB_0011a26c:
      bVar21 = true;
    }
    if (*pcVar15 == '?') {
      sVar12 = strlen(pcVar15);
      memmove(pcVar15 + 1,local_b0,sVar12 + 1);
      *local_b0 = '/';
      bVar21 = true;
      pcVar15 = local_b0;
LAB_0011a319:
      in_connect = local_b8;
      local_b0 = pcVar15;
      if (bVar21) {
        local_68 = strlen(pcVar15);
        sVar12 = strlen((data->change).url);
        sVar11 = strlen((pcVar8->host).name);
        if ((char)local_bc == '\0') {
          sVar14 = strlen(local_a8);
          sVar11 = sVar11 + sVar14 + 3;
        }
        pcVar9 = (char *)(*Curl_cmalloc)(sVar12 + 2);
        if (pcVar9 == (char *)0x0) goto LAB_0011a58f;
        memcpy(pcVar9,(data->change).url,sVar11);
        memcpy(pcVar9 + sVar11,local_b0,local_68 + 1);
        if ((data->change).url_alloc == true) {
          pcVar15 = (data->change).url;
          if (pcVar15 != (char *)0x0) {
            (*Curl_cfree)(pcVar15);
            (data->change).url = (char *)0x0;
          }
          (data->change).url_alloc = false;
        }
        Curl_infof(data,"Rebuilt URL to: %s\n",pcVar9);
        (data->change).url = pcVar9;
        (data->change).url_alloc = true;
      }
      CVar5 = CURLE_OK;
      local_80 = (char *)0x0;
      local_70 = (char *)0x0;
      local_78 = (char *)0x0;
      pcVar9 = (pcVar8->host).name;
      pcVar15 = strchr(pcVar9,0x40);
      if (pcVar15 != (char *)0x0) {
        (pcVar8->host).name = pcVar15 + 1;
        if (((data->set).use_netrc != CURL_NETRC_REQUIRED) &&
           (CVar5 = parse_login_details(pcVar9,(size_t)(pcVar15 + 1 + ~(ulong)pcVar9),&local_80,
                                        &local_70,&local_78), CVar5 == CURLE_OK)) {
          if (local_80 != (char *)0x0) {
            (pcVar8->bits).userpwd_in_url = true;
            (pcVar8->bits).user_passwd = true;
            pcVar9 = curl_easy_unescape(data,local_80,0,(int *)0x0);
            if (pcVar9 == (char *)0x0) {
              CVar5 = CURLE_OUT_OF_MEMORY;
              goto LAB_0011a47e;
            }
            (*Curl_cfree)(local_98);
            local_98 = pcVar9;
          }
          CVar5 = CURLE_OK;
          if (local_70 != (char *)0x0) {
            pcVar9 = curl_easy_unescape(data,local_70,0,(int *)0x0);
            if (pcVar9 == (char *)0x0) {
              CVar5 = CURLE_OUT_OF_MEMORY;
              goto LAB_0011a47e;
            }
            (*Curl_cfree)(local_a0);
            local_a0 = pcVar9;
          }
          if (local_78 != (char *)0x0) {
            pcVar9 = curl_easy_unescape(data,local_78,0,(int *)0x0);
            if (pcVar9 == (char *)0x0) {
              CVar5 = CURLE_OUT_OF_MEMORY;
            }
            else {
              (*Curl_cfree)(local_90);
              local_90 = pcVar9;
            }
          }
        }
      }
LAB_0011a47e:
      if (local_80 != (char *)0x0) {
        (*Curl_cfree)(local_80);
        local_80 = (char *)0x0;
      }
      protocol_done = local_c8;
      if (local_70 != (char *)0x0) {
        (*Curl_cfree)(local_70);
        local_70 = (char *)0x0;
      }
      if (local_78 != (char *)0x0) {
        (*Curl_cfree)(local_78);
        local_78 = (char *)0x0;
      }
      if (CVar5 == CURLE_OK) {
        pcVar9 = (pcVar8->host).name;
        if ((*pcVar9 == '[') && (pcVar9 = strchr(pcVar9,0x25), pcVar9 != (char *)0x0)) {
          lVar18 = 3;
          iVar4 = strncmp("%25",pcVar9,3);
          if (iVar4 != 0) {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            lVar18 = 1;
          }
          uVar16 = strtoul(pcVar9 + lVar18,&local_80,10);
          pcVar15 = local_80;
          if (*local_80 == ']') {
            local_68 = uVar16;
            sVar12 = strlen(local_80);
            memmove(pcVar9,pcVar15,sVar12 + 1);
            pcVar8->scope = (uint)local_68;
          }
          else {
            Curl_infof(data,"Invalid IPv6 address format\n");
          }
        }
        uVar2 = (data->set).scope;
        if (uVar2 != 0) {
          pcVar8->scope = uVar2;
        }
        pcVar9 = strchr(local_b0,0x23);
        if (pcVar9 != (char *)0x0) {
          *pcVar9 = '\0';
          pcVar9 = strchr((data->change).url,0x23);
          if (pcVar9 != (char *)0x0) {
            *pcVar9 = '\0';
          }
        }
        pCVar20 = &Curl_handler_http;
        ppCVar19 = protocols;
        do {
          ppCVar19 = ppCVar19 + 1;
          iVar4 = Curl_raw_equal(pCVar20->scheme,local_a8);
          if (iVar4 != 0) {
            if ((((uint)(data->set).allowed_protocols & pCVar20->protocol) != 0) &&
               (((data->state).this_is_a_follow != true ||
                (((uint)(data->set).redir_protocols & pCVar20->protocol) != 0)))) {
              pcVar8->given = pCVar20;
              pcVar8->handler = pCVar20;
              CVar5 = CURLE_OK;
              protocol_done = local_c8;
              goto LAB_0011a6c5;
            }
            break;
          }
          pCVar20 = *ppCVar19;
        } while (pCVar20 != (Curl_handler *)0x0);
        Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_a8);
        CVar5 = CURLE_UNSUPPORTED_PROTOCOL;
        protocol_done = local_c8;
      }
    }
    else {
      pcVar9 = Curl_dedotdotify(pcVar15);
      if (pcVar9 != (char *)0x0) {
        iVar4 = strcmp(pcVar9,pcVar15);
        if (iVar4 == 0) {
          (*Curl_cfree)(pcVar9);
        }
        else {
          (*Curl_cfree)((data->state).pathbuffer);
          (data->state).pathbuffer = pcVar9;
          (data->state).path = pcVar9;
          bVar21 = true;
          pcVar15 = pcVar9;
        }
      }
      in_connect = local_b8;
      if (pcVar9 != (char *)0x0) goto LAB_0011a319;
LAB_0011a58f:
      CVar5 = CURLE_OUT_OF_MEMORY;
      protocol_done = local_c8;
    }
  }
  else {
    *local_b0 = '\0';
    local_bc = 0;
    iVar4 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",local_48,
                            (pcVar8->host).name);
    if (1 < iVar4) goto LAB_0011a1f1;
    pcVar9 = local_b0;
    iVar4 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar8->host).name,local_b0);
    if (0 < iVar4) {
      iVar4 = Curl_raw_nequal("FTP.",(pcVar8->host).name,4);
      local_bc = (undefined4)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
      if (iVar4 == 0) {
        iVar4 = Curl_raw_nequal("DICT.",(pcVar8->host).name,5);
        if (iVar4 == 0) {
          iVar4 = Curl_raw_nequal("LDAP.",(pcVar8->host).name,5);
          if (iVar4 == 0) {
            iVar4 = Curl_raw_nequal("IMAP.",(pcVar8->host).name,5);
            if (iVar4 == 0) {
              iVar4 = Curl_raw_nequal("SMTP.",(pcVar8->host).name,5);
              if (iVar4 == 0) {
                iVar4 = Curl_raw_nequal("POP3.",(pcVar8->host).name,5);
                local_a8 = "pop3";
                if (iVar4 == 0) {
                  local_a8 = "http";
                }
              }
              else {
                local_a8 = "smtp";
              }
            }
            else {
              local_a8 = "IMAP";
            }
          }
          else {
            local_a8 = "LDAP";
          }
        }
        else {
          local_a8 = "DICT";
        }
      }
      else {
        local_a8 = "ftp";
      }
      goto LAB_0011a1f1;
    }
    local_bc = 0;
    Curl_failf(data,"<url> malformed");
    CVar5 = CURLE_URL_MALFORMAT;
  }
LAB_0011a6c5:
  if (CVar5 != CURLE_OK) goto LAB_00119fbd;
  if ((char)local_bc != '\0') {
    pcVar9 = curl_maprintf("%s://%s",pcVar8->handler->scheme,(data->change).url);
    if (pcVar9 == (char *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
    else {
      if ((data->change).url_alloc == true) {
        pcVar15 = (data->change).url;
        if (pcVar15 != (char *)0x0) {
          (*Curl_cfree)(pcVar15);
          (data->change).url = (char *)0x0;
        }
        (data->change).url_alloc = false;
      }
      (data->change).url = pcVar9;
      (data->change).url_alloc = true;
      CVar5 = CURLE_OK;
    }
    protocol_done = local_c8;
    if (pcVar9 == (char *)0x0) goto LAB_00119fbd;
  }
  if (((pcVar8->given->flags & 0x40) != 0) &&
     (pcVar9 = strchr((pcVar8->data->state).path,0x3f), pcVar9 != (char *)0x0)) {
    *pcVar9 = '\0';
  }
  pcVar9 = (data->set).str[0x27];
  if (pcVar9 != (char *)0x0) {
    pcVar9 = (*Curl_cstrdup)(pcVar9);
    pcVar8->xoauth2_bearer = pcVar9;
    if (pcVar9 == (char *)0x0) goto LAB_00119fb7;
  }
  if (((pcVar8->bits).proxy_user_passwd == true) &&
     (CVar5 = parse_proxy_auth(data,pcVar8), CVar5 != CURLE_OK)) goto LAB_00119fbd;
  pcVar9 = (data->set).str[0x10];
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = (*Curl_cstrdup)(pcVar9);
    if (pcVar9 == (char *)0x0) {
      Curl_failf(data,"memory shortage");
      CVar5 = CURLE_OUT_OF_MEMORY;
      protocol_done = local_c8;
      goto LAB_00119fbd;
    }
  }
  pcVar15 = (data->set).str[0x21];
  if ((pcVar15 == (char *)0x0) || (_Var22 = check_noproxy((pcVar8->host).name,pcVar15), !_Var22)) {
    if (pcVar9 == (char *)0x0) {
      pcVar9 = detect_proxy(pcVar8);
    }
  }
  else {
    if (pcVar9 != (char *)0x0) {
      (*Curl_cfree)(pcVar9);
    }
    pcVar9 = (char *)0x0;
  }
  if (pcVar9 == (char *)0x0) {
LAB_0011a870:
    pcVar9 = (char *)0x0;
  }
  else if ((*pcVar9 == '\0') || ((pcVar8->handler->flags & 0x10) != 0)) {
    (*Curl_cfree)(pcVar9);
    goto LAB_0011a870;
  }
  if (pcVar9 == (char *)0x0) {
    (pcVar8->bits).proxy = false;
    (pcVar8->bits).httpproxy = false;
    (pcVar8->bits).proxy_user_passwd = false;
    (pcVar8->bits).tunnel_proxy = false;
  }
  else {
    CVar5 = parse_proxy(data,pcVar8,pcVar9);
    (*Curl_cfree)(pcVar9);
    protocol_done = local_c8;
    if (CVar5 != CURLE_OK) goto LAB_00119fbd;
    if (pcVar8->proxytype < 2) {
      _Var22 = true;
      if (((pcVar8->handler->protocol & 3) == 0) && ((pcVar8->bits).tunnel_proxy == false)) {
        pcVar8->handler = &Curl_handler_http;
      }
    }
    else {
      _Var22 = false;
    }
    (pcVar8->bits).httpproxy = _Var22;
    (pcVar8->bits).proxy = true;
  }
  protocol_done = local_c8;
  if (((pcVar8->given->flags & 1) != 0) && ((pcVar8->bits).httpproxy == true)) {
    (pcVar8->bits).tunnel_proxy = true;
  }
  CVar5 = parse_remote_port(data,pcVar8);
  if ((((CVar5 == CURLE_OK) &&
       (CVar5 = override_login(data,pcVar8,&local_98,&local_a0,&local_90), CVar5 == CURLE_OK)) &&
      (CVar5 = set_login(pcVar8,local_98,local_a0,local_90), CVar5 == CURLE_OK)) &&
     (CVar5 = setup_connection_internals(pcVar8), CVar5 == CURLE_OK)) {
    pcVar8->recv[0] = Curl_recv_plain;
    pcVar8->send[0] = Curl_send_plain;
    pcVar8->recv[1] = Curl_recv_plain;
    pcVar8->send[1] = Curl_send_plain;
    if ((pcVar8->handler->flags & 0x10) == 0) {
      pcVar9 = (data->set).str[0x15];
      (data->set).ssl.CApath = (data->set).str[0x14];
      (data->set).ssl.CAfile = pcVar9;
      pcVar9 = (data->set).str[0x1b];
      (data->set).ssl.CRLfile = (data->set).str[0x1a];
      (data->set).ssl.issuercert = pcVar9;
      (data->set).ssl.random_file = (data->set).str[0x18];
      (data->set).ssl.egdsocket = (data->set).str[0x17];
      (data->set).ssl.cipher_list = (data->set).str[0x16];
      _Var22 = Curl_clone_ssl_config(&(data->set).ssl,&pcVar8->ssl_config);
      CVar5 = CURLE_OUT_OF_MEMORY;
      if (_Var22) {
        prune_dead_connections(data);
        if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
          _Var22 = false;
        }
        else {
          _Var22 = ConnectionExists(data,pcVar8,&local_50,&local_c9);
        }
        pcVar17 = local_50;
        if (((_Var22 != false) && (local_c9 == false)) &&
           ((_Var3 = IsPipeliningPossible(data,local_50), _Var3 &&
            (((pcVar17->recv_pipe->size + pcVar17->send_pipe->size != 0 &&
              (Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                          pcVar17->connection_id),
              (SessionHandle *)pcVar17->bundle->num_connections < local_60)) &&
             (((data->state).conn_cache)->num_connections < local_58)))))) {
          _Var22 = false;
          Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
        }
        pcVar17 = local_50;
        if (_Var22 == false) {
          bundle = (connectbundle *)(pcVar8->host).name;
          pSVar6 = (SessionHandle *)
                   Curl_conncache_find_bundle((data->state).conn_cache,(char *)bundle);
          bVar21 = false;
          if ((local_60 != (SessionHandle *)0x0) && (bVar21 = false, pSVar6 != (SessionHandle *)0x0)
             ) {
            if (pSVar6->prev < local_60) {
              bVar21 = false;
            }
            else {
              pcVar17 = find_oldest_idle_connection_in_bundle(pSVar6,bundle);
              if (pcVar17 == (connectdata *)0x0) {
                bVar21 = true;
              }
              else {
                pcVar17->data = data;
                bVar21 = false;
                Curl_disconnect(pcVar17,false);
              }
            }
          }
          if ((local_58 != 0) && (local_58 <= ((data->state).conn_cache)->num_connections)) {
            pcVar17 = find_oldest_idle_connection(data);
            if (pcVar17 == (connectdata *)0x0) {
              bVar21 = true;
            }
            else {
              pcVar17->data = data;
              Curl_disconnect(pcVar17,false);
            }
          }
          if (bVar21) {
            Curl_infof(data,"No connections available.\n");
            conn_free(pcVar8);
            *local_b8 = (connectdata *)0x0;
            CVar5 = CURLE_NO_CONNECTION_AVAILABLE;
          }
          else {
            Curl_conncache_add_conn((data->state).conn_cache,pcVar8);
            if ((((data->state).authhost.picked & 0x28) != 0) &&
               ((data->state).authhost.done == true)) {
              Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
              (data->state).authhost.picked = 0;
            }
            CVar5 = CURLE_OK;
            if ((((data->state).authproxy.picked & 0x28) != 0) &&
               ((data->state).authproxy.done == true)) {
              CVar5 = CURLE_OK;
              Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
              (data->state).authproxy.picked = 0;
            }
          }
          in_connect = local_b8;
          protocol_done = local_c8;
          asyncp = local_88;
          if (bVar21) goto LAB_00119fbd;
        }
        else {
          local_50->inuse = true;
          reuse_conn(pcVar8,local_50);
          (*Curl_cfree)(pcVar8);
          *local_b8 = pcVar17;
          fix_hostname(data,(connectdata *)&pcVar17->host,host);
          Curl_infof(data,"Re-using existing connection! (#%ld) with host %s\n",
                     pcVar17->connection_id,
                     *(undefined8 *)
                      (pcVar17->primary_ip +
                      (ulong)((pcVar17->proxy).name != (char *)0x0) * 0x20 + -0x34));
          pcVar8 = pcVar17;
        }
        pcVar8->inuse = true;
        do_init(pcVar8);
        CVar5 = setup_range(data);
        asyncp = local_88;
        in_connect = local_b8;
        protocol_done = local_c8;
        if (CVar5 == CURLE_OK) {
          pcVar8->fread_func = (data->set).fread_func;
          pcVar8->fread_in = (data->set).in;
          pcVar8->seek_func = (data->set).seek_func;
          pcVar8->seek_client = (data->set).seek_client;
          CVar5 = resolve_server(data,pcVar8,local_88);
          in_connect = local_b8;
          protocol_done = local_c8;
        }
      }
    }
    else {
      CVar5 = (*pcVar8->handler->connect_it)(pcVar8,(_Bool *)local_48);
      if (CVar5 == CURLE_OK) {
        pcVar8->data = data;
        (pcVar8->bits).tcpconnect[0] = true;
        Curl_conncache_add_conn((data->state).conn_cache,pcVar8);
        CVar5 = setup_range(data);
        if (CVar5 != CURLE_OK) {
          (*pcVar8->handler->done)(pcVar8,CVar5,false);
          in_connect = local_b8;
          protocol_done = local_c8;
          goto LAB_00119fbd;
        }
        CVar5 = CURLE_OK;
        Curl_setup_transfer(pcVar8,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      }
      do_init(pcVar8);
      in_connect = local_b8;
      protocol_done = local_c8;
    }
  }
LAB_00119fbd:
  if (local_90 != (char *)0x0) {
    (*Curl_cfree)(local_90);
    local_90 = (char *)0x0;
  }
  if (local_a0 != (char *)0x0) {
    (*Curl_cfree)(local_a0);
    local_a0 = (char *)0x0;
  }
  if (local_98 != (char *)0x0) {
    (*Curl_cfree)(local_98);
    local_98 = (char *)0x0;
  }
  if (CVar5 == CURLE_OK) {
    pcVar8 = *in_connect;
    if ((pcVar8->send_pipe->size == 0) && (pcVar8->recv_pipe->size == 0)) {
      CVar5 = CURLE_OK;
      if (*asyncp == false) {
        CVar5 = Curl_setup_conn(pcVar8,protocol_done);
      }
    }
    else {
      *protocol_done = true;
      CVar5 = CURLE_OK;
    }
  }
  if (CVar5 != CURLE_OK) {
    if (CVar5 != CURLE_NO_CONNECTION_AVAILABLE) {
      if (*in_connect == (connectdata *)0x0) {
        return CVar5;
      }
      Curl_disconnect(*in_connect,false);
    }
    *in_connect = (connectdata *)0x0;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return code;
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}